

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_server_socket.c
# Opt level: O1

void test_accept_bind_uds_no_stale_file(void)

{
  cio_address_family family;
  cio_error cVar1;
  int *piVar2;
  cio_server_socket ss;
  cio_socket_address endpoint;
  cio_eventloop loop;
  
  cio_init_uds_socket_address(&endpoint,"/tmp/foobar");
  family = cio_socket_address_get_family(&endpoint);
  cVar1 = cio_server_socket_init(&ss,&loop,5,family,alloc_client,free_client,10,on_close);
  UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0x2fc,UNITY_DISPLAY_STYLE_INT);
  unlink_fake.return_val = -1;
  piVar2 = __errno_location();
  *piVar2 = 2;
  cVar1 = cio_server_socket_bind(&ss,&endpoint);
  UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0x302,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber(0,(ulong)close_fake.call_count,(char *)0x0,0x304,UNITY_DISPLAY_STYLE_INT);
  cio_server_socket_close(&ss);
  UnityAssertEqualNumber(1,(ulong)close_fake.call_count,(char *)0x0,0x306,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)unlink_fake.call_count,"unlink was called",0x308,UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_accept_bind_uds_no_stale_file(void)
{
	struct cio_eventloop loop;
	struct cio_server_socket ss;

	struct cio_socket_address endpoint;
	cio_init_uds_socket_address(&endpoint, "/tmp/foobar");

	enum cio_error err = cio_server_socket_init(&ss, &loop, 5, cio_socket_address_get_family(&endpoint), alloc_client, free_client, 10, on_close);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);

	unlink_fake.return_val = -1;
	errno = ENOENT;

	err = cio_server_socket_bind(&ss, &endpoint);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);

	TEST_ASSERT_EQUAL(0, close_fake.call_count);
	cio_server_socket_close(&ss);
	TEST_ASSERT_EQUAL(1, close_fake.call_count);

	TEST_ASSERT_EQUAL_MESSAGE(1, unlink_fake.call_count, "unlink was called");
}